

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMAttrImpl::setValue(DOMAttrImpl *this,XMLCh *val)

{
  DOMDocument *pDVar1;
  DOMNode *pDVar2;
  bool bVar3;
  int iVar4;
  DOMException *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DOMNodeIDMap *pDVar5;
  DOMDocumentImpl *local_98;
  MemoryManager *local_88;
  DOMDocumentImpl *local_78;
  long local_68;
  MemoryManager *local_58;
  DOMNode *node;
  DOMNode *kid;
  DOMDocumentImpl *doc;
  XMLCh *val_local;
  DOMAttrImpl *this_local;
  
  bVar3 = DOMNodeImpl::isReadOnly(&this->fNode);
  if (bVar3) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this == (DOMAttrImpl *)0x0) {
      local_58 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar4 = (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var,iVar4) == 0) {
        local_68 = 0;
      }
      else {
        local_68 = CONCAT44(extraout_var,iVar4) + -8;
      }
      if (local_68 == 0) {
        local_88 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar4 = (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_00,iVar4) == 0) {
          local_78 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_78 = (DOMDocumentImpl *)(CONCAT44(extraout_var_00,iVar4) + -8);
        }
        local_88 = DOMDocumentImpl::getMemoryManager(local_78);
      }
      local_58 = local_88;
    }
    DOMException::DOMException(this_00,7,0,local_58);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  pDVar1 = (this->fParent).fOwnerDocument;
  if (pDVar1 == (DOMDocument *)0x0) {
    local_98 = (DOMDocumentImpl *)0x0;
  }
  else {
    local_98 = (DOMDocumentImpl *)&pDVar1[-1].super_DOMNode;
  }
  bVar3 = DOMNodeImpl::isIdAttr(&this->fNode);
  if (bVar3) {
    pDVar5 = DOMDocumentImpl::getNodeIDMap(local_98);
    DOMNodeIDMap::remove(pDVar5,(char *)this);
  }
  while (pDVar2 = (this->fParent).fFirstChild, pDVar2 != (DOMNode *)0x0) {
    iVar4 = (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[0x10])(this,pDVar2);
    if ((long *)CONCAT44(extraout_var_01,iVar4) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x138))();
    }
  }
  if (val != (XMLCh *)0x0) {
    iVar4 = (*(local_98->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x3e])(local_98,val);
    DOMParentNode::appendChildFast(&this->fParent,(DOMNode *)CONCAT44(extraout_var_02,iVar4));
  }
  DOMNodeImpl::isSpecified(&this->fNode,true);
  DOMParentNode::changed(&this->fParent);
  bVar3 = DOMNodeImpl::isIdAttr(&this->fNode);
  if (bVar3) {
    pDVar5 = DOMDocumentImpl::getNodeIDMap(local_98);
    DOMNodeIDMap::add(pDVar5,&this->super_DOMAttr);
  }
  return;
}

Assistant:

void DOMAttrImpl::setValue(const XMLCh *val)
{
    if (fNode.isReadOnly())
    {
        throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNodeMemoryManager);
    }

    //  If this attribute was of type ID and in the map, take it out,
    //    then put it back in with the new name.  For now, we don't worry
    //    about what happens if the new name conflicts
    //
    DOMDocumentImpl *doc = (DOMDocumentImpl *)fParent.fOwnerDocument;
    if (fNode.isIdAttr())
        doc->getNodeIDMap()->remove(this);

    DOMNode *kid;
    while ((kid = fParent.fFirstChild) != 0)         // Remove existing kids
    {
        DOMNode* node = removeChild(kid);
        if (node)
            node->release();
    }

    if (val != 0)              // Create and add the new one
        fParent.appendChildFast(doc->createTextNode(val));
    fNode.isSpecified(true);
    fParent.changed();

    if (fNode.isIdAttr())
        doc->getNodeIDMap()->add(this);

}